

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O3

Vector3d * ear::toCartesianVector3d(Vector3d *__return_storage_ptr__,SpeakerPosition *position)

{
  uint uVar1;
  long lVar2;
  storage_t *psVar3;
  type *ptVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  type local_120 [5];
  double local_f8;
  double local_d0;
  byte local_a8;
  long *local_a0 [2];
  long local_90 [2];
  char local_80;
  long *local_78 [2];
  long local_68 [2];
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  undefined8 uStack_20;
  
  uVar1 = position->which_ >> 0x1f ^ position->which_;
  if (uVar1 < 0x14) {
    switch(uVar1) {
    case 0:
      psVar3 = &position->storage_;
      ptVar4 = local_120;
      for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
        *ptVar4 = (psVar3->super_aligned_storage_imp<200UL,_8UL>).data_.align_;
        psVar3 = (storage_t *)((long)&(psVar3->super_aligned_storage_imp<200UL,_8UL>).data_ + 8);
        ptVar4 = ptVar4 + 1;
      }
      local_a8 = 0;
      bVar6 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0x78] == '\x01';
      if (bVar6) {
        local_a0[0] = local_90;
        lVar2 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                         0x80);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,lVar2,
                   *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_
                            + 0x88) + lVar2);
      }
      local_80 = 0;
      bVar5 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0xa0] == '\x01';
      local_a8 = bVar6;
      if (bVar5) {
        local_78[0] = local_68;
        lVar2 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                         0xa8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,lVar2,
                   *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_
                            + 0xb0) + lVar2);
      }
      local_28 = local_d0;
      uStack_20 = 0;
      local_80 = bVar5;
      local_38 = sin((double)local_120[0] * -0.017453292519943295);
      dVar7 = local_f8 * 0.017453292519943295;
      local_48 = cos(dVar7);
      dVar8 = cos((double)local_120[0] * -0.017453292519943295);
      local_58 = cos(dVar7);
      dVar7 = sin(dVar7);
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] = local_28 * local_48 * local_38;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[1] = local_28 * local_58 * dVar8;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] = dVar7 * local_28;
      if (local_80 == '\x01') {
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        local_80 = '\0';
      }
      if (local_a8 != 1) {
        return __return_storage_ptr__;
      }
      break;
    case 1:
      psVar3 = &position->storage_;
      ptVar4 = local_120;
      for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
        *ptVar4 = (psVar3->super_aligned_storage_imp<200UL,_8UL>).data_.align_;
        psVar3 = (storage_t *)((long)&(psVar3->super_aligned_storage_imp<200UL,_8UL>).data_ + 8);
        ptVar4 = ptVar4 + 1;
      }
      local_a8 = 0;
      bVar6 = (position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0x78] == '\x01';
      if (bVar6) {
        local_a0[0] = local_90;
        lVar2 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                         0x80);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,lVar2,
                   *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_
                            + 0x88) + lVar2);
      }
      local_80 = 0;
      local_a8 = bVar6;
      if ((position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_.buf[0xa0] == '\x01') {
        lVar2 = *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_ +
                         0xa8);
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,lVar2,
                   *(long *)((long)&(position->storage_).super_aligned_storage_imp<200UL,_8UL>.data_
                            + 0xb0) + lVar2);
        local_80 = 1;
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[0] = (double)local_120[0];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[1] = local_f8;
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] = local_d0;
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
      else {
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[0] = (double)local_120[0];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[1] = local_f8;
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] = local_d0;
      }
      local_80 = '\0';
      if ((local_a8 & 1) == 0) {
        return __return_storage_ptr__;
      }
      break;
    default:
      goto switchD_0014a598_caseD_2;
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    return __return_storage_ptr__;
  }
switchD_0014a598_caseD_2:
  boost::detail::variant::forced_return<Eigen::Matrix<double,3,1,0,3,1>>();
}

Assistant:

Eigen::Vector3d toCartesianVector3d(SpeakerPosition position) {
    return boost::apply_visitor(
        [](const auto& p) { return toCartesianVector3d(p); }, position);
  }